

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O2

int __thiscall
IServer::SendPackMsg<CNetMsg_Sv_VoteOptionRemove>
          (IServer *this,CNetMsg_Sv_VoteOptionRemove *pMsg,int Flags,int ClientID)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  CMsgPacker Packer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMsgPacker::CMsgPacker(&Packer,0xe,false);
  bVar2 = CNetMsg_Sv_VoteOptionRemove::Pack(pMsg,&Packer);
  if (bVar2) {
    iVar3 = -1;
  }
  else {
    iVar3 = (*(this->super_IInterface)._vptr_IInterface[9])
                      (this,&Packer,(ulong)(uint)Flags,(ulong)(uint)ClientID);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int SendPackMsg(T *pMsg, int Flags, int ClientID)
	{
		CMsgPacker Packer(pMsg->MsgID(), false);
		if(pMsg->Pack(&Packer))
			return -1;
		return SendMsg(&Packer, Flags, ClientID);
	}